

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_srtp_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> SVar1;
  int iVar2;
  stack_st_SRTP_PROTECTION_PROFILE *sk;
  Type *pTVar3;
  size_t sVar4;
  byte bVar5;
  CBS *out;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> SVar6;
  uint16_t profile_id;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> __begin1;
  CBS profile_ids_tmp;
  CBS profile_ids;
  CBS srtp_mki;
  
  bVar5 = 1;
  if (contents != (CBS *)0x0) {
    ssl = (SSL *)hs->ssl;
    iVar2 = SSL_is_dtls((SSL *)ssl);
    if (iVar2 != 0) {
      iVar2 = CBS_get_u16_length_prefixed(contents,&profile_ids);
      if ((iVar2 != 0) && (1 < profile_ids.len)) {
        out = &srtp_mki;
        iVar2 = CBS_get_u8_length_prefixed(contents,out);
        if ((iVar2 != 0) && (contents->len == 0)) {
          sk = (stack_st_SRTP_PROTECTION_PROFILE *)SSL_get_srtp_profiles(ssl);
          __begin1.idx_ = 0;
          __begin1.sk_ = sk;
          SVar6 = end<stack_st_SRTP_PROTECTION_PROFILE>(sk);
          sVar4 = 0;
          while( true ) {
            SVar1.idx_ = sVar4;
            SVar1.sk_ = sk;
            bVar5 = (byte)out;
            if (SVar6 == SVar1) break;
            pTVar3 = internal::StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE>::operator*
                               (&__begin1);
            profile_ids_tmp.data = profile_ids.data;
            profile_ids_tmp.len = profile_ids.len;
            while (profile_ids_tmp.len != 0) {
              iVar2 = CBS_get_u16(&profile_ids_tmp,&profile_id);
              bVar5 = iVar2 != 0;
              out = (CBS *)(ulong)bVar5;
              if (iVar2 == 0) goto LAB_00138ba7;
              if (pTVar3->id == (ulong)profile_id) {
                *(Type **)(ssl->handshake_func + 0x280) = pTVar3;
                goto LAB_00138ba7;
              }
            }
            sVar4 = __begin1.idx_ + 1;
            sk = __begin1.sk_;
            __begin1.idx_ = sVar4;
          }
LAB_00138ba7:
          bVar5 = SVar6 == SVar1 | bVar5;
          goto LAB_00138ae0;
        }
      }
      bVar5 = 0;
      ERR_put_error(0x10,0,0x74,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x6c3);
    }
  }
LAB_00138ae0:
  return (bool)(bVar5 & 1);
}

Assistant:

static bool ext_srtp_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                       CBS *contents) {
  SSL *const ssl = hs->ssl;
  // DTLS-SRTP is only defined for DTLS.
  if (contents == NULL || !SSL_is_dtls(ssl)) {
    return true;
  }

  CBS profile_ids, srtp_mki;
  if (!CBS_get_u16_length_prefixed(contents, &profile_ids) ||
      CBS_len(&profile_ids) < 2 ||
      !CBS_get_u8_length_prefixed(contents, &srtp_mki) ||
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_SRTP_PROTECTION_PROFILE_LIST);
    return false;
  }
  // Discard the MKI value for now.

  const STACK_OF(SRTP_PROTECTION_PROFILE) *server_profiles =
      SSL_get_srtp_profiles(ssl);

  // Pick the server's most preferred profile.
  for (const SRTP_PROTECTION_PROFILE *server_profile : server_profiles) {
    CBS profile_ids_tmp;
    CBS_init(&profile_ids_tmp, CBS_data(&profile_ids), CBS_len(&profile_ids));

    while (CBS_len(&profile_ids_tmp) > 0) {
      uint16_t profile_id;
      if (!CBS_get_u16(&profile_ids_tmp, &profile_id)) {
        return false;
      }

      if (server_profile->id == profile_id) {
        ssl->s3->srtp_profile = server_profile;
        return true;
      }
    }
  }

  return true;
}